

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void round_shift_lowbd_write_buffer_avx2(__m128i *in,int bit,uint8_t *output,int stride,int flipud)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int in_ECX;
  ulong *in_RDX;
  char in_SIL;
  long in_RDI;
  int in_R8D;
  __m128i res_57;
  __m128i res_46;
  __m128i res_13;
  __m128i res_02;
  __m256i res_4567;
  __m256i res_0123;
  __m256i x3;
  __m256i x2;
  __m256i x1;
  __m256i x0;
  __m256i unpcklo3;
  __m256i unpcklo2;
  __m256i unpcklo1;
  __m256i unpcklo0;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m256i zero;
  __m256i scale;
  int step;
  int j;
  __m256i v_256 [4];
  __m256i in_256 [4];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined1 auStack_ab0 [16];
  undefined1 auStack_a90 [16];
  undefined8 uStack_590;
  undefined8 uStack_588;
  ulong uStack_558;
  undefined8 local_1b0;
  undefined8 local_190;
  undefined8 local_130;
  undefined8 local_110;
  
  iVar26 = 7;
  if (in_R8D == 0) {
    iVar26 = 0;
  }
  uVar27 = -(uint)(in_R8D != 0) | 1;
  uVar28 = 1 << (in_SIL + 0xfU & 0x1f);
  auVar8 = vpinsrw_avx(ZEXT216((ushort)uVar28),uVar28 & 0xffff,1);
  auVar8 = vpinsrw_avx(auVar8,uVar28 & 0xffff,2);
  auVar8 = vpinsrw_avx(auVar8,uVar28 & 0xffff,3);
  auVar8 = vpinsrw_avx(auVar8,uVar28 & 0xffff,4);
  auVar8 = vpinsrw_avx(auVar8,uVar28 & 0xffff,5);
  auVar8 = vpinsrw_avx(auVar8,uVar28 & 0xffff,6);
  auVar8 = vpinsrw_avx(auVar8,uVar28 & 0xffff,7);
  auVar9 = vpinsrw_avx(ZEXT216((ushort)uVar28),uVar28 & 0xffff,1);
  auVar9 = vpinsrw_avx(auVar9,uVar28 & 0xffff,2);
  auVar9 = vpinsrw_avx(auVar9,uVar28 & 0xffff,3);
  auVar9 = vpinsrw_avx(auVar9,uVar28 & 0xffff,4);
  auVar9 = vpinsrw_avx(auVar9,uVar28 & 0xffff,5);
  auVar9 = vpinsrw_avx(auVar9,uVar28 & 0xffff,6);
  auVar9 = vpinsrw_avx(auVar9,uVar28 & 0xffff,7);
  uStack_590 = auVar9._0_8_;
  uStack_588 = auVar9._8_8_;
  uStack_558 = SUB328(ZEXT832(0),4);
  puVar4 = (undefined8 *)(in_RDI + (long)(int)(iVar26 + uVar27) * 0x10);
  iVar1 = iVar26 + uVar27 * 2;
  puVar5 = (undefined8 *)(in_RDI + (long)(int)(iVar1 + uVar27) * 0x10);
  iVar2 = iVar1 + uVar27 * 2;
  puVar6 = (undefined8 *)(in_RDI + (long)(int)(iVar2 + uVar27) * 0x10);
  iVar3 = iVar2 + uVar27 * 2;
  puVar7 = (undefined8 *)(in_RDI + (long)(int)(iVar3 + uVar27) * 0x10);
  auVar17._16_8_ = *puVar4;
  auVar17._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar26 * 0x10);
  auVar17._24_8_ = puVar4[1];
  auVar10._16_8_ = uStack_590;
  auVar10._0_16_ = auVar8;
  auVar10._24_8_ = uStack_588;
  auVar10 = vpmulhrsw_avx2(auVar17,auVar10);
  auVar16._16_8_ = *puVar5;
  auVar16._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar1 * 0x10);
  auVar16._24_8_ = puVar5[1];
  auVar11._16_8_ = uStack_590;
  auVar11._0_16_ = auVar8;
  auVar11._24_8_ = uStack_588;
  auVar11 = vpmulhrsw_avx2(auVar16,auVar11);
  auVar15._16_8_ = *puVar6;
  auVar15._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar2 * 0x10);
  auVar15._24_8_ = puVar6[1];
  auVar12._16_8_ = uStack_590;
  auVar12._0_16_ = auVar8;
  auVar12._24_8_ = uStack_588;
  auVar12 = vpmulhrsw_avx2(auVar15,auVar12);
  auVar14._16_8_ = *puVar7;
  auVar14._0_16_ = *(undefined1 (*) [16])(in_RDI + (long)iVar3 * 0x10);
  auVar14._24_8_ = puVar7[1];
  auVar13._16_8_ = uStack_590;
  auVar13._0_16_ = auVar8;
  auVar13._24_8_ = uStack_588;
  auVar13 = vpmulhrsw_avx2(auVar14,auVar13);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *in_RDX;
  auVar21._16_8_ = *(undefined8 *)((long)in_RDX + (long)in_ECX);
  auVar21._24_8_ = 0;
  auVar14 = vpunpcklbw_avx2(auVar21,ZEXT832(uStack_558) << 0x40);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)((long)in_RDX + (long)(in_ECX * 2));
  auVar20._16_8_ = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3));
  auVar20._24_8_ = 0;
  auVar15 = vpunpcklbw_avx2(auVar20,ZEXT832(uStack_558) << 0x40);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)((long)in_RDX + (long)(in_ECX << 2));
  auVar19._16_8_ = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 5));
  auVar19._24_8_ = 0;
  auVar16 = vpunpcklbw_avx2(auVar19,ZEXT832(uStack_558) << 0x40);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)((long)in_RDX + (long)(in_ECX * 6));
  auVar18._16_8_ = *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7));
  auVar18._24_8_ = 0;
  auVar17 = vpunpcklbw_avx2(auVar18,ZEXT832(uStack_558) << 0x40);
  auVar10 = vpaddsw_avx2(auVar10,auVar14);
  auVar11 = vpaddsw_avx2(auVar11,auVar15);
  auVar12 = vpaddsw_avx2(auVar12,auVar16);
  auVar13 = vpaddsw_avx2(auVar13,auVar17);
  auVar10 = vpackuswb_avx2(auVar10,auVar11);
  auVar11 = vpackuswb_avx2(auVar12,auVar13);
  auStack_a90._0_8_ = auVar10._16_8_;
  uVar25 = auStack_a90._0_8_;
  auStack_a90 = auVar10._16_16_;
  auStack_ab0._0_8_ = auVar11._16_8_;
  uVar24 = auStack_ab0._0_8_;
  auStack_ab0 = auVar11._16_16_;
  *in_RDX = uVar25;
  *(undefined8 *)((long)in_RDX + (long)in_ECX) = local_ae0;
  auVar8 = vpunpckhqdq_avx(auStack_a90,auStack_a90);
  local_110 = auVar8._0_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 2)) = local_110;
  auVar23._8_8_ = uStack_ad8;
  auVar23._0_8_ = local_ae0;
  auVar22._8_8_ = uStack_ad8;
  auVar22._0_8_ = local_ae0;
  auVar8 = vpunpckhqdq_avx(auVar23,auVar22);
  local_130 = auVar8._0_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3)) = local_130;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX << 2)) = uVar24;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 5)) = local_b00;
  auVar8 = vpunpckhqdq_avx(auStack_ab0,auStack_ab0);
  local_190 = auVar8._0_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 6)) = local_190;
  auVar9._8_8_ = uStack_af8;
  auVar9._0_8_ = local_b00;
  auVar8._8_8_ = uStack_af8;
  auVar8._0_8_ = local_b00;
  auVar8 = vpunpckhqdq_avx(auVar9,auVar8);
  local_1b0 = auVar8._0_8_;
  *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7)) = local_1b0;
  return;
}

Assistant:

static inline void round_shift_lowbd_write_buffer_avx2(__m128i *in, int bit,
                                                       uint8_t *output,
                                                       int stride, int flipud) {
  __m256i in_256[4], v_256[4];
  int j = flipud ? 7 : 0;
  const int step = flipud ? -1 : 1;
  const __m256i scale = _mm256_set1_epi16(1 << (15 + bit));
  const __m256i zero = _mm256_setzero_si256();
  // in[0], in[1]
  in_256[0] =
      _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]), in[j + step], 1);
  j += 2 * step;
  // in[2], in[3]
  in_256[1] =
      _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]), in[j + step], 1);
  j += 2 * step;
  // in[4], in[5]
  in_256[2] =
      _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]), in[j + step], 1);
  j += 2 * step;
  // in[6], in[7]
  in_256[3] =
      _mm256_inserti128_si256(_mm256_castsi128_si256(in[j]), in[j + step], 1);

  // i00 i01 i02 i03 i04 i05 i06 i07 i10 i11 i12 i13 i14 i15 i16 i17
  in_256[0] = _mm256_mulhrs_epi16(in_256[0], scale);
  // i20 i21 i22 i23 i24 i25 i26 i27 i30 i31 i32 i33 i34 i35 i36 i37
  in_256[1] = _mm256_mulhrs_epi16(in_256[1], scale);
  // i40 i41 i42 i43 i44 i45 i46 i47 i50 i51 i52 i53 i54 i55 i56 i57
  in_256[2] = _mm256_mulhrs_epi16(in_256[2], scale);
  // i60 i61 i62 i63 i64 i65 i66 i67 i70 i71 i72 i73 i74 i75 i76 i77
  in_256[3] = _mm256_mulhrs_epi16(in_256[3], scale);

  const __m128i v0 = _mm_loadl_epi64((__m128i const *)(output));
  const __m128i v1 = _mm_loadl_epi64((__m128i const *)(output + stride));
  const __m128i v2 = _mm_loadl_epi64((__m128i const *)(output + 2 * stride));
  const __m128i v3 = _mm_loadl_epi64((__m128i const *)(output + 3 * stride));
  const __m128i v4 = _mm_loadl_epi64((__m128i const *)(output + 4 * stride));
  const __m128i v5 = _mm_loadl_epi64((__m128i const *)(output + 5 * stride));
  const __m128i v6 = _mm_loadl_epi64((__m128i const *)(output + 6 * stride));
  const __m128i v7 = _mm_loadl_epi64((__m128i const *)(output + 7 * stride));

  v_256[0] = _mm256_inserti128_si256(_mm256_castsi128_si256(v0), v1, 1);
  v_256[1] = _mm256_inserti128_si256(_mm256_castsi128_si256(v2), v3, 1);
  v_256[2] = _mm256_inserti128_si256(_mm256_castsi128_si256(v4), v5, 1);
  v_256[3] = _mm256_inserti128_si256(_mm256_castsi128_si256(v6), v7, 1);

  const __m256i unpcklo0 = _mm256_unpacklo_epi8(v_256[0], zero);
  const __m256i unpcklo1 = _mm256_unpacklo_epi8(v_256[1], zero);
  const __m256i unpcklo2 = _mm256_unpacklo_epi8(v_256[2], zero);
  const __m256i unpcklo3 = _mm256_unpacklo_epi8(v_256[3], zero);
  // 00 01 10 11
  const __m256i x0 = _mm256_adds_epi16(in_256[0], unpcklo0);
  // 20 21 30 31
  const __m256i x1 = _mm256_adds_epi16(in_256[1], unpcklo1);
  // 40 41 50 51
  const __m256i x2 = _mm256_adds_epi16(in_256[2], unpcklo2);
  // 60 61 70 71
  const __m256i x3 = _mm256_adds_epi16(in_256[3], unpcklo3);

  // 00 01 20 21 10 11 30 31
  const __m256i res_0123 = _mm256_packus_epi16(x0, x1);
  // 40 41 60 61 50 51 70 71
  const __m256i res_4567 = _mm256_packus_epi16(x2, x3);

  // 00 01 20 21
  const __m128i res_02 = _mm256_castsi256_si128(res_0123);
  // 10 11 30 31
  const __m128i res_13 = _mm256_extracti128_si256(res_0123, 1);
  // 40 41 60 61
  const __m128i res_46 = _mm256_castsi256_si128(res_4567);
  // 50 51 70 71
  const __m128i res_57 = _mm256_extracti128_si256(res_4567, 1);

  // 00 01
  _mm_storel_epi64((__m128i *)(output), res_02);
  // 10 11
  _mm_storel_epi64((__m128i *)(output + stride), res_13);
  // 20 21
  _mm_storel_epi64((__m128i *)(output + 2 * stride),
                   _mm_unpackhi_epi64(res_02, res_02));
  // 30 31
  _mm_storel_epi64((__m128i *)(output + 3 * stride),
                   _mm_unpackhi_epi64(res_13, res_13));
  // 40 41
  _mm_storel_epi64((__m128i *)(output + 4 * stride), res_46);
  // 50 51
  _mm_storel_epi64((__m128i *)(output + 5 * stride), res_57);
  // 60 61
  _mm_storel_epi64((__m128i *)(output + 6 * stride),
                   _mm_unpackhi_epi64(res_46, res_46));
  // 70 71
  _mm_storel_epi64((__m128i *)(output + 7 * stride),
                   _mm_unpackhi_epi64(res_57, res_57));
}